

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_0::TestExceptionCallback::logMessage
          (TestExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  __int_type _Var1;
  ProcessContext *pPVar2;
  size_t sVar3;
  kj *this_00;
  TestExceptionCallback *pTVar4;
  Array<char> *params_1;
  char *pcVar5;
  String *params_3;
  ArrayPtr<void_*const> AVar6;
  ArrayPtr<void_*const> trace;
  ArrayPtr<void_*> space;
  String *pSVar7;
  String *in_stack_fffffffffffffe60;
  int line_local;
  Array<char> local_190;
  kj *local_178;
  char *file_local;
  Array<char> local_168;
  Array<char> local_150;
  void *traceSpace [32];
  
  line_local = line;
  file_local = file;
  memset((kj *)traceSpace,0,0x100);
  space.size_ = 2;
  space.ptr = (void **)0x20;
  AVar6 = getStackTrace((kj *)traceSpace,space,line);
  trace.ptr = (void **)AVar6.size_;
  local_178 = (kj *)AVar6.ptr;
  if ((text->content).size_ < 2) {
    heapString((String *)&local_190,"expectation failed");
    Array<char>::operator=(&text->content,&local_190);
    Array<char>::~Array(&local_190);
  }
  local_150.size_ = (size_t)contextDepth;
  local_150.ptr._0_1_ = 0x5f;
  params_1 = &local_168;
  local_168.ptr._0_1_ = 0x3a;
  params_3 = (String *)0x4d498f;
  pSVar7 = text;
  str<kj::Repeat<char>,char_const*&,char,int&,char_const(&)[3],kj::String>
            ((String *)&local_190,(kj *)&local_150,(Repeat<char> *)&file_local,&params_1->ptr,
             (char *)&line_local,(int *)0x4d498f,(char (*) [3])text,in_stack_fffffffffffffe60);
  Array<char>::operator=(&text->content,&local_190);
  Array<char>::~Array(&local_190);
  this_00 = local_178;
  pTVar4 = this;
  if ((severity & ~WARNING) == ERROR) {
    do {
      LOCK();
      _Var1 = (pTVar4->sawError)._M_base._M_i;
      (pTVar4->sawError)._M_base._M_i = true;
      params_1 = (Array<char> *)CONCAT71((int7)((ulong)params_1 >> 8),_Var1);
      UNLOCK();
      pTVar4 = (pTVar4->mainThreadCallback).ptr;
    } while (pTVar4 != (TestExceptionCallback *)0x0);
    pPVar2 = this->context;
    AVar6.size_ = (size_t)pSVar7;
    AVar6.ptr = (void **)0x3f2491;
    stringifyStackTraceAddresses(AVar6);
    trace.size_ = (size_t)params_1;
    stringifyStackTrace((String *)&local_168,this_00,trace);
    str<kj::String&,char_const(&)[9],kj::String,kj::String>
              ((String *)&local_190,(kj *)text,(String *)0x4e83c7,(char (*) [9])&local_150,
               (String *)&local_168,params_3);
    if (local_190.size_ == 0) {
      local_190.ptr = "";
    }
    (*pPVar2->_vptr_ProcessContext[3])
              (pPVar2,local_190.ptr,local_190.size_ + (local_190.size_ == 0));
    Array<char>::~Array(&local_190);
    Array<char>::~Array(&local_168);
    Array<char>::~Array(&local_150);
  }
  else {
    sVar3 = (text->content).size_;
    if (sVar3 == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (text->content).ptr;
    }
    (*this->context->_vptr_ProcessContext[2])(this->context,pcVar5,sVar3 + (sVar3 == 0));
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    void* traceSpace[32]{};
    auto trace = getStackTrace(traceSpace, 2);

    if (text.size() == 0) {
      text = kj::heapString("expectation failed");
    }

    text = kj::str(kj::repeat('_', contextDepth), file, ':', line, ": ", kj::mv(text));

    if (severity == LogSeverity::ERROR || severity == LogSeverity::FATAL) {
      fail();
      context.error(kj::str(text, "\nstack: ", stringifyStackTraceAddresses(trace), stringifyStackTrace(trace)));
    } else {
      context.warning(text);
    }
  }